

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BristolCircuit.cpp
# Opt level: O2

bool __thiscall
Circuit::base_circuit
          (Circuit *this,vector<unsigned_char,_std::allocator<unsigned_char>_> *inputs,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *outputs)

{
  GateType GVar1;
  pointer pGVar2;
  uint *puVar3;
  uint i;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  runtime_error *this_00;
  uchar uVar7;
  uint *puVar8;
  pointer puVar9;
  byte bVar10;
  pointer puVar11;
  uint uVar12;
  uint uVar13;
  allocator_type local_31;
  vector<unsigned_char,_std::allocator<unsigned_char>_> W;
  
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            (&W,(ulong)this->nWires,&local_31);
  for (uVar6 = 0; uVar6 < this->nWires; uVar6 = uVar6 + 1) {
    W.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
    super__Vector_impl_data._M_start[uVar6] = 0xff;
  }
  puVar11 = (this->numI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start;
  uVar5 = 0;
  for (uVar4 = 0;
      (ulong)uVar4 <
      (ulong)((long)(this->numI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_finish - (long)puVar11 >> 2);
      uVar4 = uVar4 + 1) {
    for (uVar12 = 0; uVar13 = uVar5 + uVar12, uVar12 < puVar11[uVar4]; uVar12 = uVar12 + 1) {
      W.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[uVar13] =
           (inputs->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start[uVar13];
      puVar11 = (this->numI).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                .super__Vector_impl_data._M_start;
    }
    uVar5 = uVar13;
  }
  uVar5 = 0;
  do {
    uVar6 = (ulong)uVar5;
    pGVar2 = (this->GateT).super__Vector_base<GateType,_std::allocator<GateType>_>._M_impl.
             super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->GateT).super__Vector_base<GateType,_std::allocator<GateType>_>._M_impl.
                      super__Vector_impl_data._M_finish - (long)pGVar2 >> 2) <= uVar6) {
      uVar5 = total_num_out(this);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(outputs,(ulong)uVar5);
      uVar5 = this->nWires;
      puVar11 = (this->numO).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                .super__Vector_impl_data._M_finish;
      puVar9 = (this->numO).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
      for (uVar4 = 0; (ulong)uVar4 < (ulong)((long)puVar11 - (long)puVar9 >> 2); uVar4 = uVar4 + 1)
      {
        uVar5 = uVar5 - puVar9[uVar4];
      }
      uVar4 = 0;
      for (uVar12 = 0; (ulong)uVar12 < (ulong)((long)puVar11 - (long)puVar9 >> 2);
          uVar12 = uVar12 + 1) {
        uVar13 = 0;
        while( true ) {
          if (puVar9[uVar12] <= uVar13) break;
          (outputs->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
          super__Vector_impl_data._M_start[uVar4 + uVar13] =
               W.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start[uVar5 + uVar13];
          uVar13 = uVar13 + 1;
          puVar9 = (this->numO).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_start;
        }
        puVar11 = (this->numO).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_finish;
        uVar5 = uVar5 + uVar13;
        uVar4 = uVar4 + uVar13;
      }
      std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                (&W.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
      return true;
    }
    GVar1 = pGVar2[uVar6];
    if (GVar1 == INV) {
      bVar10 = W.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start
               [*(this->GateI).
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar6].
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start] ^ 1;
      puVar8 = (this->GateO).
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar6].
               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_start;
LAB_00104849:
      W.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[*puVar8] = bVar10;
    }
    else {
      if (GVar1 == EQ) {
        uVar7 = **(uchar **)
                  &(this->GateI).
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar6].
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data;
        uVar4 = *(this->GateO).
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar6].
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start;
      }
      else {
        if (GVar1 != EQW) {
          puVar8 = (this->GateO).
                   super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[uVar6].
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          if (GVar1 == XOR) {
            puVar3 = (this->GateI).
                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar6].
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            bVar10 = W.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start[puVar3[1]] ^
                     W.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start[*puVar3];
          }
          else {
            if (GVar1 != AND) {
              if (GVar1 == MAND) {
                this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error(this_00,"MAND not supported");
              }
              else {
                this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
                std::runtime_error::runtime_error(this_00,"not_implemented");
              }
              __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
            }
            puVar3 = (this->GateI).
                     super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[uVar6].
                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_start;
            bVar10 = W.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start[puVar3[1]] &
                     W.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_start[*puVar3];
          }
          goto LAB_00104849;
        }
        uVar7 = W.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                super__Vector_impl_data._M_start
                [*(this->GateI).
                  super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[uVar6].
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start];
        uVar4 = *(this->GateO).
                 super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar6].
                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_start;
      }
      W.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start[uVar4] = uVar7;
    }
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

bool Circuit::base_circuit(const vector<uint8_t> &inputs,
                           vector<uint8_t> &outputs) const {
  vector<uint8_t> W(nWires);
  for (unsigned int i = 0; i < nWires; i++) {
    W[i] = -1;
  }

  // Load inputs
  unsigned int cnt = 0;
  for (unsigned int i = 0; i < numI.size(); i++) {
    for (unsigned int j = 0; j < numI[i]; j++) {
      W[cnt] = inputs[cnt];
      cnt++;
    }
  }

  // Evaluate the circuit
  for (unsigned int i = 0; i < GateT.size();
       i++) { // First check if ordering is broken
    if (GateT[i] != EQ && W[GateI[i][0]] < 0) {
      throw std::runtime_error("Circuit error");
    }
    if (GateT[i] != INV && GateT[i] != EQ && GateT[i] != EQW) {
      for (unsigned int j = 1; j < GateO[i].size(); j++) {
        if (W[GateI[i][j]] < 0) {
          throw std::runtime_error("Circuit error");
        }
      }
    }
    // Now evaluate the gate
    if (GateT[i] == AND) {
      W[GateO[i][0]] = W[GateI[i][0]] & W[GateI[i][1]];
    } else if (GateT[i] == MAND) {

      throw std::runtime_error("MAND not supported");
      // for (unsigned int j= 0; j < GateO[i].size(); j++)
      //  {
      //    W[GateO[i][j]]= W[GateI[i][j]] & W[GateI[i][j + GateO[i].size()]];
      //  }
    } else if (GateT[i] == XOR) {
      W[GateO[i][0]] = W[GateI[i][0]] ^ W[GateI[i][1]];
    } else if (GateT[i] == EQ) {
      W[GateO[i][0]] = GateI[i][0];
    } else if (GateT[i] == EQW) {
      W[GateO[i][0]] = W[GateI[i][0]];
    } else if (GateT[i] == INV) {
      W[GateO[i][0]] = 1 ^ W[GateI[i][0]];
    } else {
      throw std::runtime_error("not_implemented");
    }
  }

  // Now produce the output
  outputs.resize(total_num_out());
  cnt = nWires;
  unsigned int cntOut = 0;
  for (unsigned int i = 0; i < numO.size(); i++) {
    cnt -= numO[i];
  }
  for (unsigned int i = 0; i < numO.size(); i++) {
    // outputs[i].resize(numO[i]);
    for (unsigned int j = 0; j < numO[i]; j++) {
      outputs[cntOut] = W[cnt];
      cnt++;
      cntOut++;
    }
  }
  return true;
}